

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-reference.c
# Opt level: O0

void KeccakP1600_Permute_24rounds(void *state)

{
  undefined8 in_RDI;
  
  KeccakP1600OnWords((tKeccakLane *)state,(uint)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

void KeccakP1600_Permute_24rounds(void *state)
{
#if (PLATFORM_BYTE_ORDER != IS_LITTLE_ENDIAN)
    tKeccakLane stateAsWords[1600/64];
#endif

#ifdef KeccakReference
    displayStateAsBytes(1, "Input of permutation", (const unsigned char *)state, 1600);
#endif
#if (PLATFORM_BYTE_ORDER == IS_LITTLE_ENDIAN)
    KeccakP1600OnWords((tKeccakLane*)state, 24);
#else
    fromBytesToWords(stateAsWords, (const unsigned char *)state);
    KeccakP1600OnWords(stateAsWords, 24);
    fromWordsToBytes((unsigned char *)state, stateAsWords);
#endif
#ifdef KeccakReference
    displayStateAsBytes(1, "State after permutation", (const unsigned char *)state, 1600);
#endif
}